

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::SocketNetwork>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::SocketNetwork> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    NetworkFilter::~NetworkFilter((NetworkFilter *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x68);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }